

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

void nonius::
     validate_benchmarks<std::chrono::_V2::system_clock,__gnu_cxx::__normal_iterator<nonius::benchmark*,std::vector<nonius::benchmark,std::allocator<nonius::benchmark>>>>
               (__normal_iterator<nonius::benchmark_*,_std::vector<nonius::benchmark,_std::allocator<nonius::benchmark>_>_>
                first,__normal_iterator<nonius::benchmark_*,_std::vector<nonius::benchmark,_std::allocator<nonius::benchmark>_>_>
                      last)

{
  bool bVar1;
  duplicate_benchmarks *this;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>,_bool>
  pVar2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_strings_lt_through_pointer,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  names;
  __normal_iterator<nonius::benchmark_*,_std::vector<nonius::benchmark,_std::allocator<nonius::benchmark>_>_>
  *in_stack_ffffffffffffff68;
  __normal_iterator<nonius::benchmark_*,_std::vector<nonius::benchmark,_std::allocator<nonius::benchmark>_>_>
  *in_stack_ffffffffffffff70;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  in_stack_ffffffffffffff88;
  byte in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff91;
  __normal_iterator<nonius::benchmark_*,_std::vector<nonius::benchmark,_std::allocator<nonius::benchmark>_>_>
  local_8;
  
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_strings_lt_through_pointer,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_strings_lt_through_pointer,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
         *)0x2167b1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    if (!bVar1) {
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_strings_lt_through_pointer,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_strings_lt_through_pointer,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
              *)0x21689b);
      return;
    }
    __gnu_cxx::
    __normal_iterator<nonius::benchmark_*,_std::vector<nonius::benchmark,_std::allocator<nonius::benchmark>_>_>
    ::operator->(&local_8);
    pVar2 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_strings_lt_through_pointer,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_strings_lt_through_pointer,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                      *)CONCAT71(in_stack_ffffffffffffff91,in_stack_ffffffffffffff90),
                     (value_type *)in_stack_ffffffffffffff88._M_node);
    in_stack_ffffffffffffff88 = pVar2.first._M_node;
    in_stack_ffffffffffffff90 = pVar2.second;
    if (((in_stack_ffffffffffffff90 ^ 0xff) & 1) != 0) break;
    __gnu_cxx::
    __normal_iterator<nonius::benchmark_*,_std::vector<nonius::benchmark,_std::allocator<nonius::benchmark>_>_>
    ::operator++(&local_8);
  }
  this = (duplicate_benchmarks *)__cxa_allocate_exception(8);
  *this = (duplicate_benchmarks)0x0;
  duplicate_benchmarks::duplicate_benchmarks(this);
  __cxa_throw(this,&duplicate_benchmarks::typeinfo,duplicate_benchmarks::~duplicate_benchmarks);
}

Assistant:

void validate_benchmarks(Iterator first, Iterator last) {
        struct strings_lt_through_pointer {
            bool operator()(std::string* a, std::string* b) const { return *a < *b; };
        };
        std::set<std::string*, strings_lt_through_pointer> names;
        for(; first != last; ++first) {
            if(!names.insert(&first->name).second)
                throw duplicate_benchmarks();
        }
    }